

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

void __thiscall Connection::onDataAvailable(Connection *this,SharedPtr *client,Buffer *buf)

{
  Buffers *__position;
  uint uVar1;
  undefined8 *puVar2;
  ssize_t sVar3;
  int *piVar4;
  ulong uVar5;
  undefined *in_RCX;
  uint uVar6;
  long lVar7;
  int t;
  _Alloc_hider _Var8;
  shared_ptr<Message> *args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  LinkedList<Buffer> *__range1;
  void *__buf;
  shared_ptr<Connection> that;
  shared_ptr<Message> message;
  MessageError error;
  StackBuffer<16384UL,_char> buffer;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_4108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4100;
  int *local_40f8;
  undefined1 local_40f0 [16];
  _Alloc_hider local_40e0;
  undefined1 local_40d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40b0;
  Signal<std::function<void_(std::shared_ptr<Message>,_std::shared_ptr<Connection>)>_> *local_40a0;
  Buffer *local_4098;
  Log local_4090;
  Log local_4080;
  Log local_4070;
  Log local_4060;
  Log local_4050;
  int local_4040 [4096];
  int *local_40;
  void *local_38;
  
  __position = &this->mBuffers;
  local_40a0 = &this->mNewMessage;
  local_40f8 = &this->mFinishStatus;
  local_40b0._8_8_ = &this->mFinished;
  local_40b0._M_allocated_capacity = (size_type)&this->mErrorHandler;
  local_40e0._M_p = (pointer)client;
  local_4098 = buf;
  do {
    if (local_4098->bufferSize != 0) {
      std::__cxx11::list<Buffer,_std::allocator<Buffer>_>::_M_insert<Buffer>
                ((list<Buffer,_std::allocator<Buffer>_> *)__position,(iterator)__position,local_4098
                );
    }
    lVar7 = 0;
    for (puVar2 = &((__position->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
                    super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node.
                    super__List_node_base._M_next)->_M_next; (Buffers *)puVar2 != __position;
        puVar2 = (undefined8 *)*puVar2) {
      lVar7 = lVar7 + puVar2[3];
    }
    uVar6 = (int)lVar7 - (int)(this->mBuffers).mBufferOffset;
    if (uVar6 == 0) {
      return;
    }
    if (this->mPendingRead == 0) {
      if (uVar6 < 4) {
        return;
      }
      sVar3 = Buffers::read(__position,(int)local_4040,(void *)0x4,(size_t)in_RCX);
      if ((int)sVar3 != 4) {
        __assert_fail("read == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                      ,0x83,
                      "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)"
                     );
      }
      this->mPendingRead = local_4040[0];
      if (local_4040[0] < 1) {
        __assert_fail("mPendingRead > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                      ,0x85,
                      "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)"
                     );
      }
      uVar6 = uVar6 - 4;
    }
    uVar1 = this->mPendingRead;
    __buf = (void *)(long)(int)uVar1;
    if ((long)__buf < 0) {
      __assert_fail("mPendingRead >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                    ,0x88,
                    "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)");
    }
    if (uVar6 < uVar1) {
      return;
    }
    local_40 = (int *)0x0;
    piVar4 = local_4040;
    local_38 = __buf;
    if (0x4000 < uVar1) {
      piVar4 = (int *)operator_new__((ulong)__buf);
    }
    local_40 = piVar4;
    uVar5 = Buffers::read(__position,(int)piVar4,__buf,(size_t)in_RCX);
    if (this->mPendingRead != (int)uVar5) {
      __assert_fail("read == mPendingRead",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                    ,0x8e,
                    "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)");
    }
    this->mPendingRead = 0;
    local_40d8._0_4_ = Message_Success;
    local_40d8._8_8_ = &local_40c0;
    local_40d8._16_8_ = 0;
    local_40c0._M_local_buf[0] = '\0';
    in_RCX = (undefined *)(uVar5 & 0xffffffff);
    Message::create((Message *)local_40f0,this->mVersion,(char *)local_40,(int)uVar5,
                    (MessageError *)local_40d8);
    if ((element_type *)local_40f0._0_8_ == (element_type *)0x0) {
      if ((this->mErrorHandler).super__Function_base._M_manager == (_Manager_type)0x0) {
        local_4108.mValue = 1;
        Log::Log(&local_4080,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_4108);
        Log::write(&local_4070,(int)&local_4080,"Unable to create message from data",0xffffffff);
        Log::addStringStream<int>(&local_4060,(int)&local_4070);
        in_RCX = (undefined *)(local_40d8._16_8_ & 0xffffffff);
        Log::write((Log *)&local_4108,(int)&local_4060,(void *)local_40d8._8_8_,(size_t)in_RCX);
        if (local_4100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4100);
        }
        Log::Log(&local_4090,&local_4060);
        t = (int)&local_4090;
        Log::addStringStream<int>(&local_4050,t);
        if (local_4050.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4050.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_4090.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4090.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_4060.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4060.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        this_00._M_pi =
             local_4080.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (local_4070.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4070.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this_00._M_pi =
               local_4080.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
        goto LAB_00142957;
      }
      _Var8._M_p = local_40e0._M_p;
      (*(this->mErrorHandler)._M_invoker)
                ((_Any_data *)local_40b0._M_allocated_capacity,
                 (shared_ptr<SocketClient> *)local_40e0._M_p,(MessageError *)local_40d8);
      t = (int)_Var8._M_p;
    }
    else {
      std::__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Connection,void>
                ((__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2> *)&local_4108,
                 (__weak_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
      if (*(uint8_t *)(local_40f0._0_8_ + 8) == '\x02') {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40f0._8_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          *local_40f8 = *(int *)&((element_type *)(local_40f0._0_8_ + 0x50))->_vptr_Message;
        }
        else {
          in_RCX = &__libc_single_threaded;
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_40f0._8_8_ + 8) = *(_Atomic_word *)(local_40f0._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_40f0._8_8_ + 8) = *(_Atomic_word *)(local_40f0._8_8_ + 8) + 1;
          }
          *local_40f8 = *(int *)&((element_type *)(local_40f0._0_8_ + 0x50))->_vptr_Message;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40f0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40f0._8_8_);
          }
        }
        t = (int)&local_4108;
        Signal<std::function<void(std::shared_ptr<Connection>,int)>>::operator()
                  ((void *)local_40b0._8_8_,(shared_ptr<Connection> *)&local_4108,local_40f8);
        this_00._M_pi = local_4100;
      }
      else {
        args = (shared_ptr<Message> *)local_40f0;
        Signal<std::function<void(std::shared_ptr<Message>,std::shared_ptr<Connection>)>>::
        operator()(local_40a0,args,(shared_ptr<Connection> *)&local_4108);
        t = (int)args;
        this_00._M_pi = local_4100;
      }
LAB_00142957:
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
    }
    if ((element_type *)local_40f0._0_8_ == (element_type *)0x0) {
      SocketClient::close(*(SocketClient **)local_40e0._M_p,t);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40f0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40f0._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40d8._8_8_ != &local_40c0) {
      operator_delete((void *)local_40d8._8_8_);
    }
    if (((void *)0x4000 < local_38) && (local_40 != (int *)0x0)) {
      operator_delete__(local_40);
    }
  } while( true );
}

Assistant:

void Connection::onDataAvailable(const SocketClient::SharedPtr &client, Buffer&& buf)
{
    while (true) {
        if (!buf.isEmpty())
            mBuffers.push(std::forward<Buffer>(buf));

        unsigned int available = mBuffers.size();
        if (!available)
            break;
        if (!mPendingRead) {
            if (available < static_cast<int>(sizeof(uint32_t)))
                break;
            union {
                unsigned char b[sizeof(uint32_t)];
                int pending;
            };
            const int read = mBuffers.read(b, 4);
            assert(read == 4);
            mPendingRead = pending;
            assert(mPendingRead > 0);
            available -= read;
        }
        assert(mPendingRead >= 0);
        if (available < static_cast<unsigned int>(mPendingRead))
            break;

        StackBuffer<1024 * 16> buffer(mPendingRead);
        const int read = mBuffers.read(buffer.buffer(), mPendingRead);
        assert(read == mPendingRead);
        mPendingRead = 0;
        Message::MessageError error;
        std::shared_ptr<Message> message = Message::create(mVersion, buffer, read, &error);
        if (message) {
            auto that = shared_from_this();
            if (message->messageId() == FinishMessage::MessageId) {
                mFinishStatus = std::static_pointer_cast<FinishMessage>(message)->status();
                mFinished(that, mFinishStatus);
            } else {
                newMessage()(message, that);
            }
        } else if (mErrorHandler) {
            mErrorHandler(client, std::move(error));
        } else {
            ::error() << "Unable to create message from data" << error.type << error.text << read;
        }
        if (!message)
            client->close();
    }
}